

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::subSatUI16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  unsigned_short uVar1;
  int32_t iVar2;
  int32_t iVar3;
  Literal *other_local;
  Literal *this_local;
  
  iVar2 = geti32(this);
  iVar3 = geti32(other);
  uVar1 = sub_sat_u<unsigned_short>((unsigned_short)iVar2,(unsigned_short)iVar3);
  Literal(__return_storage_ptr__,(uint)uVar1);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::subSatUI16(const Literal& other) const {
  return Literal(sub_sat_u<uint16_t>(geti32(), other.geti32()));
}